

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<_54acdf1_> * __thiscall
llvm::SmallVectorImpl<$54acdf1$>::operator=
          (SmallVectorImpl<_54acdf1_> *this,SmallVectorImpl<_54acdf1_> *RHS)

{
  bool bVar1;
  iterator MinSize;
  iterator pUVar2;
  Unparsed *local_f0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<_54acdf1_> *RHS_local;
  SmallVectorImpl<_54acdf1_> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<$dd0a5239$>::isSmall
                      ((SmallVectorTemplateCommon<_dd0a5239_> *)RHS);
    if (bVar1) {
      MinSize = (iterator)
                (((long)(RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                        super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX -
                 (long)(RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                       super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX) /
                0x18);
      NewEnd = (iterator)
               (((long)(this->super_SmallVectorTemplateBase<_c3582d1e_>).
                       super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX -
                (long)(this->super_SmallVectorTemplateBase<_c3582d1e_>).
                      super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX) /
               0x18);
      if (NewEnd < MinSize) {
        pUVar2 = (iterator)
                 SmallVectorTemplateCommon<$dd0a5239$>::capacity
                           ((SmallVectorTemplateCommon<_dd0a5239_> *)this);
        if (pUVar2 < MinSize) {
          SmallVectorTemplateBase<$c3582d1e$>::destroy_range
                    ((Unparsed *)
                     (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                     super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX,
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                     super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX);
          SmallVectorTemplateCommon<$dd0a5239$>::setEnd
                    ((SmallVectorTemplateCommon<_dd0a5239_> *)this,
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                     super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<$c3582d1e$>::grow
                    (&this->super_SmallVectorTemplateBase<_c3582d1e_>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          std::
          move<Fixpp::MessageBase<Fixpp::Field,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fixpp::TagT<594u,Fixpp::Type::String>,Fixpp::TagT<247u,Fixpp::Type::S___nt<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>__Unparsed_>
                    ((Unparsed *)
                     (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                     super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX,
                     (Unparsed *)
                     ((long)(RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                            super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX
                     + (long)NewEnd * 0x18),
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                     super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX);
        }
        SmallVectorTemplateBase<$c3582d1e$>::uninitialized_move<_acb6bae_>
                  ((Unparsed *)
                   ((long)(RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                          super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX +
                   (long)NewEnd * 0x18),
                   (Unparsed *)
                   (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                   super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX,
                   (Unparsed *)
                   ((long)(this->super_SmallVectorTemplateBase<_c3582d1e_>).
                          super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX +
                   (long)NewEnd * 0x18));
        SmallVectorTemplateCommon<$dd0a5239$>::setEnd
                  ((SmallVectorTemplateCommon<_dd0a5239_> *)this,
                   (Unparsed *)
                   ((long)(this->super_SmallVectorTemplateBase<_c3582d1e_>).
                          super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX +
                   (long)MinSize * 0x18));
        clear(RHS);
      }
      else {
        local_f0 = (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                   super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
        if (MinSize != (iterator)0x0) {
          local_f0 = std::
                     move<Fixpp::MessageBase<Fixpp::Field,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fixpp::TagT<594u,Fixpp::Type::String>,Fixpp::TagT<247u,Fixpp::Type::S___nt<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>__Unparsed_>
                               ((Unparsed *)
                                (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                                super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.
                                BeginX,(Unparsed *)
                                       (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
                                       super_SmallVectorTemplateCommon<_dd0a5239_>.
                                       super_SmallVectorBase.EndX,local_f0);
        }
        SmallVectorTemplateBase<$c3582d1e$>::destroy_range
                  (local_f0,(Unparsed *)
                            (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                            super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<$dd0a5239$>::setEnd
                  ((SmallVectorTemplateCommon<_dd0a5239_> *)this,local_f0);
        clear(RHS);
      }
    }
    else {
      SmallVectorTemplateBase<$c3582d1e$>::destroy_range
                ((Unparsed *)
                 (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                 super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX,
                 (Unparsed *)
                 (this->super_SmallVectorTemplateBase<_c3582d1e_>).
                 super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX);
      bVar1 = SmallVectorTemplateCommon<$dd0a5239$>::isSmall
                        ((SmallVectorTemplateCommon<_dd0a5239_> *)this);
      if (!bVar1) {
        free((this->super_SmallVectorTemplateBase<_c3582d1e_>).
             super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX);
      }
      (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
      super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
      super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
      super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.CapacityX;
      SmallVectorTemplateCommon<$dd0a5239$>::resetToSmall
                ((SmallVectorTemplateCommon<_dd0a5239_> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}